

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtam(fitsfile *gfptr,fitsfile *mfptr,int hdupos,int *status)

{
  fitsfile *pfVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  uchar charNull [1];
  fitsfile *tmpfptr;
  long nmembers;
  char *tmpPtr [1];
  int nkeys;
  int memberPosition;
  int uriCol;
  int locationCol;
  long groupExtver;
  int iomode;
  long memberExtver;
  char memberURI [4];
  int groupIOstate;
  int memberIOstate;
  int hdutype;
  int grptype;
  int positionCol;
  int extverCol;
  int extnameCol;
  long grpid;
  long ngroups;
  char *tgrplc;
  long memberID;
  int xtensionCol;
  char card [81];
  char memberExtname [71];
  char memberAccess1 [71];
  char groupAccess1 [71];
  char memberHDUtype [71];
  char keyword [75];
  char memberAccess2 [71];
  char groupAccess2 [71];
  char groupLocation [1025];
  char memberFileName [1025];
  char tmp [1025];
  char groupFileName [1025];
  char grootname [1025];
  char tmprootname [1025];
  char memberLocation [1025];
  char cwd [1025];
  char grplc [1025];
  uchar local_27e9;
  fitsfile *local_27e8;
  char local_27dd;
  int local_27dc;
  long local_27d8;
  char *local_27d0;
  int local_27c8;
  int local_27c4;
  int local_27c0;
  int local_27bc;
  long local_27b8;
  int local_27ac;
  long local_27a8;
  char local_27a0 [4];
  int local_279c;
  int local_2798 [4];
  int local_2788;
  int local_2784;
  ulong local_2780;
  long local_2778;
  ulong local_2770;
  size_t local_2768;
  char *local_2760;
  long local_2758;
  int local_274c;
  char local_2748 [96];
  char local_26e8 [80];
  char local_2698 [80];
  char local_2648 [80];
  char local_25f8 [80];
  char local_25a8 [80];
  char local_2558 [80];
  char local_2508 [80];
  char local_24b8 [1040];
  char local_20a8 [1040];
  char local_1c98 [1040];
  char local_1888 [1040];
  char local_1478 [1040];
  char local_1068 [1040];
  char local_c58 [1040];
  char local_848 [1040];
  char local_438 [1032];
  
  local_27c4 = 0;
  local_2798[2] = 0;
  local_2798[1] = 0;
  local_27c8 = 6;
  local_27a8 = 0;
  local_27b8 = 0;
  local_2758 = 0;
  local_27d8 = 0;
  local_2770 = 0;
  local_2778 = 0;
  builtin_strncpy(local_27a0,"URL",4);
  local_27e9 = '\0';
  local_27e8 = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  ffflmd(gfptr,&local_27ac,status);
  if (local_27ac != 1) {
    ffpmsg("cannot modify grouping table (ffgtam)");
    *status = 0x15d;
    iVar2 = 0;
    goto LAB_0016f47c;
  }
  pfVar1 = mfptr;
  if (mfptr == (fitsfile *)0x0) {
    iVar2 = ffreopen(gfptr,&local_27e8,status);
    *status = iVar2;
    iVar3 = ffmahd(local_27e8,hdupos,local_2798 + 1,status);
    *status = iVar3;
    iVar2 = 0;
    pfVar1 = local_27e8;
    if (iVar3 != 0) goto LAB_0016f47c;
  }
  local_27e8 = pfVar1;
  iVar2 = ffgkys(local_27e8,"XTENSION",local_25f8,local_2748,status);
  *status = iVar2;
  if (iVar2 == 0xca) {
    builtin_strncpy(local_25f8,"PRIMARY",8);
    *status = 0;
  }
  prepare_keyvalue(local_25f8);
  iVar2 = ffgkyj(local_27e8,"EXTVER",&local_27a8,local_2748,status);
  *status = iVar2;
  if (iVar2 == 0xca) {
    local_27a8 = 1;
    *status = 0;
  }
  iVar2 = ffgkys(local_27e8,"EXTNAME",local_26e8,local_2748,status);
  *status = iVar2;
  if (iVar2 == 0xca) {
    local_26e8[0] = '\0';
    *status = 0;
  }
  prepare_keyvalue(local_26e8);
  ffghdn(local_27e8,&local_27c4);
  iVar2 = fits_get_url(local_27e8,local_20a8,local_c58,local_2698,local_2558,local_2798,status);
  *status = iVar2;
  if (local_20a8[0] == '\0') {
    strcpy(local_20a8,local_c58);
    strcpy(local_2698,local_2558);
  }
  iVar3 = fits_get_url(gfptr,local_1888,local_24b8,local_2648,local_2508,&local_279c,status);
  *status = iVar3;
  iVar2 = 0;
  if (iVar3 != 0) goto LAB_0016f47c;
  if (local_279c == 0) {
    ffpmsg("cannot modify grouping table (ffgtam)");
    *status = 0x15d;
    iVar2 = 0;
    goto LAB_0016f47c;
  }
  iVar3 = fits_strcasecmp(local_2648,"file://");
  if ((iVar3 == 0) || (iVar3 = fits_strcasecmp(local_2698,"file://"), iVar3 == 0)) {
    iVar3 = fits_get_cwd(local_848,status);
    *status = iVar3;
    iVar3 = fits_strcasecmp(local_2698,"file://");
    if (iVar3 == 0) {
      if (local_20a8[0] == '/') {
        strcpy(local_c58,local_20a8);
LAB_0016f5c3:
        iVar3 = fits_clean_url(local_c58,local_20a8,status);
        *status = iVar3;
        goto LAB_0016f5dd;
      }
      strcpy(local_c58,local_848);
      sVar4 = strlen(local_c58);
      sVar5 = strlen(local_20a8);
      if (0xfffffffffffffbfe < (sVar5 + sVar4) - 0x400) {
        sVar4 = strlen(local_c58);
        (local_c58 + sVar4)[0] = '/';
        (local_c58 + sVar4)[1] = '\0';
        strcat(local_c58,local_20a8);
        goto LAB_0016f5c3;
      }
      pcVar8 = "member path and filename is too long (ffgtam)";
LAB_0016f665:
      ffpmsg(pcVar8);
      *status = 0x7d;
      goto LAB_0016f47c;
    }
LAB_0016f5dd:
    iVar3 = fits_strcasecmp(local_2648,"file://");
    if (iVar3 == 0) {
      if (local_1888[0] == '/') {
        strcpy(local_24b8,local_1888);
      }
      else {
        strcpy(local_24b8,local_848);
        sVar4 = strlen(local_24b8);
        sVar5 = strlen(local_1888);
        if ((sVar5 + sVar4) - 0x400 < 0xfffffffffffffbff) {
          pcVar8 = "group path and filename is too long (ffgtam)";
          goto LAB_0016f665;
        }
        sVar4 = strlen(local_24b8);
        (local_24b8 + sVar4)[0] = '/';
        (local_24b8 + sVar4)[1] = '\0';
        strcat(local_24b8,local_1888);
      }
      iVar2 = fits_clean_url(local_24b8,local_1888,status);
      *status = iVar2;
    }
    iVar2 = fits_strcasecmp(local_2648,"file://");
    if ((iVar2 == 0) && (iVar2 = fits_strcasecmp(local_2698,"file://"), iVar2 == 0)) {
      fits_url2relurl(local_20a8,local_1888,local_24b8,status);
      fits_url2relurl(local_1888,local_20a8,local_c58,status);
      strcpy(local_20a8,local_c58);
      strcpy(local_1888,local_24b8);
    }
  }
  else {
    local_848[0] = '\0';
  }
  iVar2 = ffgkyj(gfptr,"EXTVER",&local_27b8,local_2748,status);
  *status = iVar2;
  ffrtnm(local_27e8->Fptr->filename,local_1068,status);
  ffrtnm(gfptr->Fptr->filename,local_1478,status);
  if ((local_27e8->Fptr != gfptr->Fptr) &&
     (iVar2 = strncmp(local_1068,local_1478,0x401), iVar2 != 0)) {
    local_27b8 = -local_27b8;
  }
  iVar2 = ffgtnm(gfptr,&local_27d8,status);
  *status = iVar2;
  iVar3 = ffgmf(gfptr,local_25f8,local_26e8,(int)local_27a8,local_27c4,local_20a8,&local_2758,status
               );
  *status = iVar3;
  if (iVar3 == 0) {
    ffpmsg("Specified HDU is already a member of the Grouping table (ffgtam)");
    iVar2 = 0x155;
  }
  else {
    iVar2 = 0;
    if (iVar3 == 0x156) {
      *status = 0;
      iVar3 = ffirow(gfptr,local_27d8,1,status);
      *status = iVar3;
      local_27d8 = local_27d8 + 1;
      iVar3 = ffgtgc(gfptr,&local_274c,&local_2784,&local_2788,local_2798 + 3,&local_27bc,
                     &local_27c0,local_2798 + 2,status);
      *status = iVar3;
      if (local_274c != 0) {
        local_27d0 = local_25f8;
        ffpcls(gfptr,local_274c,local_27d8,1,1,&local_27d0,status);
      }
      local_27d0 = local_26e8;
      if (local_2784 != 0) {
        if (local_26e8[0] == '\0') {
          ffpclb(gfptr,local_2784,local_27d8,1,1,&local_27e9,status);
        }
        else {
          ffpcls(gfptr,local_2784,local_27d8,1,1,&local_27d0,status);
        }
      }
      if (local_2788 != 0) {
        ffpclj(gfptr,local_2788,local_27d8,1,1,&local_27a8,status);
      }
      if (local_2798[3] != 0) {
        ffpclk(gfptr,local_2798[3],local_27d8,1,1,&local_27c4,status);
      }
      if (local_27bc != 0) {
        local_27d0 = local_20a8;
        ffrtnm(local_27e8->Fptr->filename,local_1068,status);
        ffrtnm(gfptr->Fptr->filename,local_1478,status);
        if ((local_27e8->Fptr == gfptr->Fptr) ||
           (iVar3 = strncmp(local_1068,local_1478,0x401), iVar3 == 0)) {
          ffpclb(gfptr,local_27bc,local_27d8,1,1,&local_27e9,status);
        }
        else {
          ffpcls(gfptr,local_27bc,local_27d8,1,1,&local_27d0,status);
        }
      }
      local_27d0 = local_27a0;
      if (local_27c0 != 0) {
        ffrtnm(local_27e8->Fptr->filename,local_1068,status);
        ffrtnm(gfptr->Fptr->filename,local_1478,status);
        iVar2 = 0;
        if ((local_27e8->Fptr == gfptr->Fptr) ||
           (iVar3 = strncmp(local_1068,local_1478,0x401), iVar3 == 0)) {
          ffpclb(gfptr,local_27c0,local_27d8,1,1,&local_27e9,status);
        }
        else {
          ffpcls(gfptr,local_27c0,local_27d8,1,1,&local_27d0,status);
        }
      }
    }
  }
  if (*status != 0) goto LAB_0016f47c;
  ffflmd(local_27e8,&local_27ac,status);
  if ((local_2798[0] == 0) || (local_27ac != 1)) {
    ffpmsg("cannot add GRPID/LC keywords to member HDU: (ffgtam)");
    pcVar8 = local_20a8;
LAB_0016fe62:
    ffpmsg(pcVar8);
  }
  else {
    iVar3 = ffgmng(local_27e8,(long *)&local_2770,status);
    *status = iVar3;
    local_27dc = 1;
    uVar7 = local_2770;
    if ((0 < (long)local_2770) && (*status == 0)) {
      local_27dd = local_848[0];
      local_2780 = local_2770;
      do {
        bVar9 = false;
        snprintf(local_25a8,0x4b,"GRPID%d");
        iVar3 = ffgkyj(local_27e8,local_25a8,&local_2778,local_2748,status);
        *status = iVar3;
        if ((local_2778 == local_27b8) && (bVar9 = true, local_2778 < 0)) {
          snprintf(local_25a8,0x4b,"GRPLC%d",local_2780);
          iVar3 = ffgkls(mfptr,local_25a8,&local_2760,local_2748,status);
          pcVar8 = local_2760;
          *status = iVar3;
          if (iVar3 == 0) {
            strcpy(local_438,local_2760);
            free(pcVar8);
          }
          if (local_27dd != '\0') {
            iVar3 = fits_is_url_absolute(local_438);
            if ((iVar3 == 0) &&
               (fits_path2url(local_438,0x401,local_24b8,status), local_24b8[0] != '/')) {
              strcpy(local_1c98,local_848);
              sVar4 = strlen(local_1c98);
              sVar5 = strlen(local_24b8);
              if (0xfffffffffffffbfe < (sVar5 + sVar4) - 0x400) {
                sVar4 = strlen(local_1c98);
                (local_1c98 + sVar4)[0] = '/';
                (local_1c98 + sVar4)[1] = '\0';
                strcat(local_1c98,local_24b8);
                fits_clean_url(local_1c98,local_438,status);
                goto LAB_0016fd31;
              }
LAB_0016fdb7:
              ffpmsg("path and group location is too long (ffgtam)");
              *status = 0x7d;
              bVar9 = false;
              goto LAB_0016fe19;
            }
LAB_0016fd31:
            iVar3 = fits_is_url_absolute(local_1888);
            if ((iVar3 == 0) &&
               (fits_path2url(local_1888,0x401,local_24b8,status), local_24b8[0] != '/')) {
              strcpy(local_1c98,local_848);
              local_2768 = strlen(local_1c98);
              sVar4 = strlen(local_24b8);
              if ((sVar4 + local_2768) - 0x400 < 0xfffffffffffffbff) goto LAB_0016fdb7;
              sVar4 = strlen(local_1c98);
              (local_1c98 + sVar4)[0] = '/';
              (local_1c98 + sVar4)[1] = '\0';
              strcat(local_1c98,local_24b8);
              fits_clean_url(local_1c98,local_24b8,status);
            }
          }
          iVar3 = strcmp(local_438,local_24b8);
          bVar9 = iVar3 == 0;
        }
LAB_0016fe19:
        lVar6 = (long)local_27dc;
        local_27dc = (int)(lVar6 + 1);
      } while (((!bVar9) && (lVar6 + 1 <= (long)local_2780)) && (*status == 0));
      uVar7 = local_2780;
      if (bVar9) {
        pcVar8 = "HDU already has GRPID/LC keywords for group table (ffgtam)";
        goto LAB_0016fe62;
      }
    }
    if (uVar7 == 0) {
      local_27dc = 0;
      *status = 0xca;
      if (0 < local_27c8) {
        do {
          if (*status != 0xca) break;
          *status = 0;
          iVar3 = ffgcrd(local_27e8,
                         (char *)((long)&DAT_001d0658 + (long)(int)(&DAT_001d0658)[local_27dc]),
                         local_2748,status);
          *status = iVar3;
          local_27dc = local_27dc + 1;
        } while (local_27dc < local_27c8);
      }
      if (*status == 0xca) {
        *status = 0;
        ffghsp(local_27e8,&local_27c8,&local_27dc,status);
        ffgrec(local_27e8,local_27c8,local_2748,status);
      }
      if (*status != 0) goto LAB_0016f47c;
    }
    uVar7 = uVar7 + 1;
    local_2770 = uVar7;
    ffrtnm(local_27e8->Fptr->filename,local_1068,status);
    ffrtnm(gfptr->Fptr->filename,local_1478,status);
    if ((local_27e8->Fptr == gfptr->Fptr) ||
       (iVar3 = strncmp(local_1068,local_1478,0x401), iVar3 == 0)) {
      snprintf(local_25a8,0x4b,"GRPID%d",uVar7 & 0xffffffff);
      ffikyj(local_27e8,local_25a8,local_27b8,"EXTVER of Group containing this HDU",status);
    }
    else {
      snprintf(local_25a8,0x4b,"GRPID%d",uVar7 & 0xffffffff);
      ffikyj(local_27e8,local_25a8,local_27b8,"EXTVER of Group containing this HDU",status);
      snprintf(local_25a8,0x4b,"GRPLC%d",uVar7 & 0xffffffff);
      ffikls(local_27e8,local_25a8,local_1888,"URL of file containing Group",status);
      ffplsw(local_27e8,status);
    }
  }
LAB_0016f47c:
  if (mfptr == (fitsfile *)0x0) {
    iVar3 = ffclos(local_27e8,status);
    *status = iVar3;
  }
  if (*status != 0) {
    iVar2 = *status;
  }
  *status = iVar2;
  return iVar2;
}

Assistant:

int ffgtam(fitsfile *gfptr,   /* FITS file pointer to grouping table HDU     */
	   fitsfile *mfptr,   /* FITS file pointer to member HDU             */
	   int       hdupos,  /* member HDU position IF in the same file as
			         the grouping table AND mfptr == NULL        */
	   int      *status)  /* return status code                          */
 
/*
  add a member HDU to an existing grouping table. The fitsfile pointer gfptr
  must be positioned with the grouping table as the CHDU. The member HDU
  may either be identifed with the fitsfile *mfptr (which must be positioned
  to the member HDU) or the hdupos parameter (the HDU number of the member 
  HDU) if both reside in the same FITS file. The hdupos value is only used
  if the mfptr parameter has a value of NULL (0). The new member HDU shall 
  have the appropriate GRPIDn and GRPLCn keywords created in its header.

  Note that if the member HDU to be added to the grouping table is already
  a member of the group then it will not be added a sceond time.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int memberPosition = 0;
  int grptype        = 0;
  int hdutype        = 0;
  int useLocation    = 0;
  int nkeys          = 6;
  int found;
  int i;

  int memberIOstate;
  int groupIOstate;
  int iomode;

  long memberExtver = 0;
  long groupExtver  = 0;
  long memberID     = 0;
  long nmembers     = 0;
  long ngroups      = 0;
  long grpid        = 0;

  char memberAccess1[FLEN_VALUE];
  char memberAccess2[FLEN_VALUE];
  char memberFileName[FLEN_FILENAME];
  char memberLocation[FLEN_FILENAME];
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char memberHDUtype[FLEN_VALUE];
  char memberExtname[FLEN_VALUE];
  char memberURI[] = "URL";

  char groupAccess1[FLEN_VALUE];
  char groupAccess2[FLEN_VALUE];
  char groupFileName[FLEN_FILENAME];
  char groupLocation[FLEN_FILENAME];
  char tmprootname[FLEN_FILENAME], grootname[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];

  char *keys[] = {"GRPNAME","EXTVER","EXTNAME","TFIELDS","GCOUNT","EXTEND"};
  char *tmpPtr[1];

  char keyword[FLEN_KEYWORD];
  char card[FLEN_CARD];

  unsigned char charNull[]  = {'\0'};

  fitsfile *tmpfptr = NULL;

  int parentStatus = 0;

  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_ATTACH;
	  continue;
	}

      /*
	 if the calling function supplied the HDU position of the member
	 HDU instead of fitsfile pointer then get a fitsfile pointer
      */

      if(mfptr == NULL)
	{
	  *status = fits_reopen_file(gfptr,&tmpfptr,status);
	  *status = fits_movabs_hdu(tmpfptr,hdupos,&hdutype,status);

	  if(*status != 0) continue;
	}
      else
	tmpfptr = mfptr;

      /*
	 determine all the information about the member HDU that will
	 be needed later; note that we establish the default values for
	 all information values that are not explicitly found
      */

      *status = fits_read_key_str(tmpfptr,"XTENSION",memberHDUtype,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  strcpy(memberHDUtype,"PRIMARY");
	  *status = 0;
	}
      prepare_keyvalue(memberHDUtype);

      *status = fits_read_key_lng(tmpfptr,"EXTVER",&memberExtver,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtver = 1;
	  *status      = 0;
	}

      *status = fits_read_key_str(tmpfptr,"EXTNAME",memberExtname,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtname[0] = 0;
	  *status          = 0;
	}
      prepare_keyvalue(memberExtname);

      fits_get_hdu_num(tmpfptr,&memberPosition);

      /*
	Determine if the member HDU's FITS file location needs to be
	taken into account when building its grouping table reference

	If the member location needs to be used (==> grouping table and member
	HDU reside in different files) then create an appropriate URL for
	the member HDU's file and grouping table's file. Note that the logic
	for this is rather complicated
      */

      /* SPR 3463, don't do this 
	 if(tmpfptr->Fptr == gfptr->Fptr)
	 {  */
	  /*
	    member HDU and grouping table reside in the same file, no need
	    to use the location information */
	  
      /* printf ("same file\n");
	   
	   useLocation     = 0;
	   memberIOstate   = 1;
	   *memberFileName = 0;
	}
      else
      { */ 
	  /*
	     the member HDU and grouping table FITS file location information 
	     must be used.

	     First determine the correct driver and file name for the group
	     table and member HDU files. If either are disk files then
	     construct an absolute file path for them. Finally, if both are
	     disk files construct relative file paths from the group(member)
	     file to the member(group) file.

	  */

	  /* set the USELOCATION flag to true */

	  useLocation = 1;

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     member HDU file
	  */

	  *status = fits_get_url(tmpfptr,memberFileName,memberLocation,
				 memberAccess1,memberAccess2,&memberIOstate,
				 status);

	  /*
	     if the memberFileName string is empty then use the values of
	     the memberLocation string. This corresponds to a file where
	     the "real" file is a temporary memory file, and we must assume
	     the the application really wants the original file to be the
	     group member
	   */

	  if(strlen(memberFileName) == 0)
	    {
	      strcpy(memberFileName,memberLocation);
	      strcpy(memberAccess1,memberAccess2);
	    }

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     grouping table file
	  */

	  *status = fits_get_url(gfptr,groupFileName,groupLocation,
				 groupAccess1,groupAccess2,&groupIOstate,
				 status);
	  
	  if(*status != 0) continue;

	  /*
	    the grouping table file must be writable to continue
	  */

	  if(groupIOstate == 0)
	    {
	      ffpmsg("cannot modify grouping table (ffgtam)");
	      *status = BAD_GROUP_ATTACH;
	      continue;
	    }

	  /*
	    determine how to construct the resulting URLs for the member and
	    group files
	  */

	  if(fits_strcasecmp(groupAccess1,"file://")  &&
	                                   fits_strcasecmp(memberAccess1,"file://"))
	    {
              *cwd = 0;
	      /* 
		 nothing to do in this case; both the member and group files
		 must be of an access type that already gives valid URLs;
		 i.e., URLs that we can pass directly to the file drivers
	      */
	    }
	  else
	    {
	      /*
		 retrieve the Current Working Directory as a Unix-like
		 URL standard string
	      */

	      *status = fits_get_cwd(cwd,status);

	      /*
		 create full file path for the member HDU FITS file URL
		 if it is of access type file://
	      */
	      
	      if(fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  if(*memberFileName == '/')
		    {
		      strcpy(memberLocation,memberFileName);
		    }
		  else
		    {
		      strcpy(memberLocation,cwd);
                      if (strlen(memberLocation)+strlen(memberFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("member path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
		      strcat(memberLocation,"/");
		      strcat(memberLocation,memberFileName);
		    }
		  
		  *status = fits_clean_url(memberLocation,memberFileName,
					   status);
		}

	      /*
		 create full file path for the grouping table HDU FITS file URL
		 if it is of access type file://
	      */

	      if(fits_strcasecmp(groupAccess1,"file://") == 0)
		{
		  if(*groupFileName == '/')
		    {
		      strcpy(groupLocation,groupFileName);
		    }
		  else
		    {
		      strcpy(groupLocation,cwd);
                      if (strlen(groupLocation)+strlen(groupFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("group path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
                      
		      strcat(groupLocation,"/");
		      strcat(groupLocation,groupFileName);
		    }
		  
		  *status = fits_clean_url(groupLocation,groupFileName,status);
		}

	      /*
		if both the member and group files are disk files then 
		create a relative path (relative URL) strings with 
		respect to the grouping table's file and the grouping table's 
		file with respect to the member HDU's file
	      */
	      
	      if(fits_strcasecmp(groupAccess1,"file://") == 0 &&
		                      fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  fits_url2relurl(memberFileName,groupFileName,
				                  groupLocation,status);
		  fits_url2relurl(groupFileName,memberFileName,
				                  memberLocation,status);

		  /*
		     copy the resulting partial URL strings to the
		     memberFileName and groupFileName variables for latter
		     use in the function
		   */
		    
		  strcpy(memberFileName,memberLocation);
		  strcpy(groupFileName,groupLocation);		  
		}
	    }
	  /* beo done */
	  /* }  */
      

      /* retrieve the grouping table's EXTVER value */

      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,status);

      /* 
	 if useLocation is true then make the group EXTVER value negative
	 for the subsequent GRPIDn/GRPLCn matching
      */
      /* SPR 3463 change test;  WDP added test for same filename */
      /* Now, if either the Fptr values are the same, or the root filenames
         are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr != gfptr->Fptr) && 
          strncmp(tmprootname, grootname, FLEN_FILENAME))
	   groupExtver = -1*groupExtver;

      /* retrieve the number of group members */

      *status = fits_get_num_members(gfptr,&nmembers,status);
	      
    do {

      /*
	 make sure the member HDU is not already an entry in the
	 grouping table before adding it
      */

      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
		      memberPosition,memberFileName,&memberID,status);

      if(*status == MEMBER_NOT_FOUND) *status = 0;
      else if(*status == 0)
	{  
	  parentStatus = HDU_ALREADY_MEMBER;
    ffpmsg("Specified HDU is already a member of the Grouping table (ffgtam)");
	  continue;
	}
      else continue;

      /*
	 if the member HDU is not already recorded in the grouping table
	 then add it 
      */

      /* add a new row to the grouping table */

      *status = fits_insert_rows(gfptr,nmembers,1,status);
      ++nmembers;

      /* retrieve the grouping table column IDs and structure type */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      /* fill in the member HDU data in the new grouping table row */

      *tmpPtr = memberHDUtype; 

      if(xtensionCol != 0)
	fits_write_col_str(gfptr,xtensionCol,nmembers,1,1,tmpPtr,status);

      *tmpPtr = memberExtname; 

      if(extnameCol  != 0)
	{
	  if(strlen(memberExtname) != 0)
	    fits_write_col_str(gfptr,extnameCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,extnameCol,nmembers,1,1,charNull,status);
	}

      if(extverCol   != 0)
	fits_write_col_lng(gfptr,extverCol,nmembers,1,1,&memberExtver,
			   status);

      if(positionCol != 0)
	fits_write_col_int(gfptr,positionCol,nmembers,1,1,
			   &memberPosition,status);

      *tmpPtr = memberFileName; 

      if(locationCol != 0)
	{
	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,locationCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,locationCol,nmembers,1,1,charNull,status);
	}

      *tmpPtr = memberURI;

      if(uriCol      != 0)
	{

	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,uriCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,uriCol,nmembers,1,1,charNull,status);
	}
    } while(0);

      if(0 != *status) continue;
      /*
	 add GRPIDn/GRPLCn keywords to the member HDU header to link
	 it to the grouing table if the they do not already exist and
	 the member file is RW
      */

      fits_file_mode(tmpfptr,&iomode,status);
 
     if(memberIOstate == 0 || iomode != READWRITE) 
	{
	  ffpmsg("cannot add GRPID/LC keywords to member HDU: (ffgtam)");
	  ffpmsg(memberFileName);
	  continue;
	}

      *status = fits_get_num_groups(tmpfptr,&ngroups,status);

      /* 
	 look for the GRPID/LC keywords in the member HDU; if the keywords
	 for the back-link to the grouping table already exist then no
	 need to add them again
       */

      for(i = 1, found = 0; i <= ngroups && !found && *status == 0; ++i)
	{
	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  *status = fits_read_key_lng(tmpfptr,keyword,&grpid,card,status);

	  if(grpid == groupExtver)
	    {
	      if(grpid < 0)
		{

		  /* have to make sure the GRPLCn keyword matches too */

		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
		  /* SPR 1738 */
		  *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,card,
						  status);
		  if (0 == *status) {
		    strcpy(grplc,tgrplc);
		    free(tgrplc);
		  }
		  
		  /*
		     always compare files using absolute paths
                     the presence of a non-empty cwd indicates
                     that the file names may require conversion
                     to absolute paths
                  */

                  if(0 < strlen(cwd)) {
                    /* temp buffer for use in assembling abs. path(s) */
                    char tmp[FLEN_FILENAME];

                    /* make grplc absolute if necessary */
                    if(!fits_is_url_absolute(grplc)) {
		      fits_path2url(grplc,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
			  fits_clean_url(tmp,grplc,status);
			}
                    }

                    /* make groupFileName absolute if necessary */
                    if(!fits_is_url_absolute(groupFileName)) {
		      fits_path2url(groupFileName,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
                          /*
                             note: use groupLocation (which is not used
                             below this block), to store the absolute
                             file name instead of using groupFileName.
                             The latter may be needed unaltered if the
                             GRPLC is written below
                          */

			  fits_clean_url(tmp,groupLocation,status);
			}
                    }
                  }
		  /*
		    see if the grplc value and the group file name match
		  */

		  if(strcmp(grplc,groupLocation) == 0) found = 1;
		}
	      else
		{
		  /* the match is found with GRPIDn alone */
		  found = 1;
		}
	    }
	}

      /*
	 if FOUND is true then no need to continue
      */

      if(found)
	{
	  ffpmsg("HDU already has GRPID/LC keywords for group table (ffgtam)");
	  continue;
	}

      /*
	 add the GRPID/LC keywords to the member header for this grouping
	 table
	 
	 If NGROUPS == 0 then we must position the header pointer to the
	 record where we want to insert the GRPID/LC keywords (the pointer
	 is already correctly positioned if the above search loop activiated)
      */

      if(ngroups == 0)
	{
	  /* 
	     no GRPIDn/GRPLCn keywords currently exist in header so try
	     to position the header pointer to a desirable position
	  */
	  
	  for(i = 0, *status = KEY_NO_EXIST; 
	                       i < nkeys && *status == KEY_NO_EXIST; ++i)
	    {
	      *status = 0;
	      *status = fits_read_card(tmpfptr,keys[i],card,status);
	    }
	      
	  /* all else fails: move write pointer to end of header */
	      
	  if(*status == KEY_NO_EXIST)
	    {
	      *status = 0;
	      fits_get_hdrspace(tmpfptr,&nkeys,&i,status);
	      ffgrec(tmpfptr,nkeys,card,status);
	    }
	  
	  /* any other error status then abort */
	  
	  if(*status != 0) continue;
	}
      
      /* 
	 now that the header pointer is positioned for the GRPID/LC 
	 keyword insertion increment the number of group links counter for 
	 the member HDU 
      */

      ++ngroups;

      /*
	 if the member HDU and grouping table reside in the same FITS file
	 then there is no need to add a GRPLCn keyword
      */
      /* SPR 3463 change test */
      /* Now, if either the Fptr values are the same, or the root filenames
	 are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr == gfptr->Fptr) || 
	          strncmp(tmprootname, grootname, FLEN_FILENAME) == 0)
	{
	  /* add the GRPIDn keyword only */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);
	}
      else 
	{
	  /* add the GRPIDn and GRPLCn keywords */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);

	  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
	  /* SPR 1738 */
	  fits_insert_key_longstr(tmpfptr,keyword,groupFileName,
			      "URL of file containing Group",status);
	  fits_write_key_longwarn(tmpfptr,status);

	}

    }while(0);

  /* close the tmpfptr pointer if it was opened in this function */

  if(mfptr == NULL)
    {
      *status = fits_close_file(tmpfptr,status);
    }

  *status = 0 == *status ? parentStatus : *status;

  return(*status);
}